

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
ChContactNSC(ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
             *this,ChContactContainer *mcontainer,ChContactable_3vars<6,_6,_6> *mobjA,
            ChContactable_3vars<3,_3,_3> *mobjB,ChCollisionInfo *cinfo,ChMaterialCompositeNSC *mat)

{
  ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>::
  ChContactTuple(&this->
                  super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
                 ,mcontainer,mobjA,mobjB,cinfo);
  (this->
  super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>)
  ._vptr_ChContactTuple = (_func_int **)&PTR__ChContactNSC_011602d0;
  ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::ChConstraintTwoTuplesContactN(&this->Nx);
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::ChConstraintTwoTuplesFrictionT(&this->Tu);
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::ChConstraintTwoTuplesFrictionT(&this->Tv);
  (this->react_force).m_data[2] = 0.0;
  (this->react_force).m_data[0] = 0.0;
  (this->react_force).m_data[1] = 0.0;
  (this->Nx).constraint_U = &this->Tu;
  (this->Nx).constraint_V = &this->Tv;
  (*(this->
    super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>
    )._vptr_ChContactTuple[0x10])(this,mobjA,mobjB,cinfo,mat);
  return;
}

Assistant:

ChContactNSC(ChContactContainer* mcontainer,           ///< contact container
                 Ta* mobjA,                                ///< collidable object A
                 Tb* mobjB,                                ///< collidable object B
                 const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                 const ChMaterialCompositeNSC&  mat        ///< composite material
                 )
        : ChContactTuple<Ta, Tb>(mcontainer, mobjA, mobjB, cinfo) {
        Nx.SetTangentialConstraintU(&Tu);
        Nx.SetTangentialConstraintV(&Tv);

        Reset(mobjA, mobjB, cinfo, mat);
    }